

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O1

QString * __thiscall
QStringDecoder::decodeAsString
          (QString *__return_storage_ptr__,QStringDecoder *this,QByteArrayView in)

{
  Interface *pIVar1;
  DecoderFn p_Var2;
  Data *pDVar3;
  qsizetype qVar4;
  
  pIVar1 = (this->super_QStringConverter).iface;
  if (pIVar1 == (Interface *)0x0) {
    (this->super_QStringConverter).state.invalidChars = 1;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qVar4 = (*pIVar1->toUtf16Len)(in.m_size);
    QString::QString(__return_storage_ptr__,qVar4,Uninitialized);
    p_Var2 = ((this->super_QStringConverter).iface)->toUtf16;
    pDVar3 = (__return_storage_ptr__->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData
                ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size
                );
    }
    (*p_Var2)((QChar *)(__return_storage_ptr__->d).ptr,in,&(this->super_QStringConverter).state);
    QString::truncate((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString decodeAsString(QByteArrayView in)
    {
        if (!iface) {
            // ensure that hasError returns true
            state.invalidChars = 1;
            return {};
        }
        QString result(iface->toUtf16Len(in.size()), Qt::Uninitialized);
        const QChar *out = iface->toUtf16(result.data(), in, &state);
        result.truncate(out - result.constData());
        return result;
    }